

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_42055d::Db::parseCallOffset(Db *this)

{
  char *pcVar1;
  bool bVar2;
  StringView SVar3;
  
  pcVar1 = this->First;
  if ((pcVar1 == this->Last) || (*pcVar1 != 'h')) {
    pcVar1 = this->First;
    if (pcVar1 == this->Last) {
      return true;
    }
    if (*pcVar1 != 'v') {
      return true;
    }
    this->First = pcVar1 + 1;
    SVar3 = parseNumber(this,true);
    if (SVar3.First == SVar3.Last) {
      return true;
    }
    pcVar1 = this->First;
    if (pcVar1 == this->Last) {
      return true;
    }
    if (*pcVar1 != '_') {
      return true;
    }
    this->First = pcVar1 + 1;
    SVar3 = parseNumber(this,true);
  }
  else {
    this->First = pcVar1 + 1;
    SVar3 = parseNumber(this,true);
  }
  bVar2 = true;
  if (((SVar3.First != SVar3.Last) && (pcVar1 = this->First, pcVar1 != this->Last)) &&
     (*pcVar1 == '_')) {
    this->First = pcVar1 + 1;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Db::parseCallOffset() {
  // Just scan through the call offset, we never add this information into the
  // output.
  if (consumeIf('h'))
    return parseNumber(true).empty() || !consumeIf('_');
  if (consumeIf('v'))
    return parseNumber(true).empty() || !consumeIf('_') ||
           parseNumber(true).empty() || !consumeIf('_');
  return true;
}